

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void google::protobuf::compiler::CodeGeneratorRequest::SharedDtor(MessageLite *self)

{
  Version *this;
  ulong uVar1;
  LogMessageFatal local_20;
  
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 6));
    this = (Version *)self[6]._internal_metadata_.ptr_;
    if (this != (Version *)0x0) {
      Version::~Version(this);
    }
    operator_delete(this,0x30);
    Impl_::~Impl_((Impl_ *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
             ,0x2c3,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void CodeGeneratorRequest::SharedDtor(MessageLite& self) {
  CodeGeneratorRequest& this_ = static_cast<CodeGeneratorRequest&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.parameter_.Destroy();
  delete this_._impl_.compiler_version_;
  this_._impl_.~Impl_();
}